

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-parser.cc
# Opt level: O1

string * __thiscall
elf_parser::Elf_parser::get_relocation_type_abi_cxx11_
          (string *__return_storage_ptr__,Elf_parser *this,uint64_t *rela_type)

{
  uint64_t uVar1;
  char *pcVar2;
  char *pcVar3;
  
  uVar1 = *rela_type;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((int)uVar1) {
  case 1:
    pcVar3 = "R_X86_64_32";
    pcVar2 = "";
    break;
  case 2:
    pcVar3 = "R_X86_64_PC32";
    pcVar2 = "";
    break;
  default:
    pcVar3 = "OTHERS";
    pcVar2 = "";
    break;
  case 5:
    pcVar3 = "R_X86_64_COPY";
    pcVar2 = "";
    break;
  case 6:
    pcVar3 = "R_X86_64_GLOB_DAT";
    pcVar2 = "";
    break;
  case 7:
    pcVar3 = "R_X86_64_JUMP_SLOT";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string Elf_parser::get_relocation_type(uint64_t &rela_type) {
    switch(ELF64_R_TYPE(rela_type)) {
        case 1: return "R_X86_64_32";
        case 2: return "R_X86_64_PC32";
        case 5: return "R_X86_64_COPY";
        case 6: return "R_X86_64_GLOB_DAT";
        case 7:  return "R_X86_64_JUMP_SLOT";
        default: return "OTHERS";
    }
}